

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int get_message_correlation_id(MESSAGE_HANDLE message,char **correlation_id)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *value;
  LOGGER_LOG l;
  AMQP_VALUE amqp_value;
  PROPERTIES_HANDLE properties;
  char **ppcStack_18;
  int result;
  char **correlation_id_local;
  MESSAGE_HANDLE message_local;
  
  ppcStack_18 = correlation_id;
  correlation_id_local = (char **)message;
  iVar1 = message_get_properties(message,(PROPERTIES_HANDLE *)&amqp_value);
  if (iVar1 == 0) {
    if (amqp_value == (AMQP_VALUE)0x0) {
      *ppcStack_18 = (char *)0x0;
      properties._4_4_ = 0;
    }
    else {
      iVar1 = properties_get_correlation_id((PROPERTIES_HANDLE)amqp_value,(AMQP_VALUE *)&l);
      if ((iVar1 == 0) && (l != (LOGGER_LOG)0x0)) {
        iVar1 = amqpvalue_get_string((AMQP_VALUE)l,(char **)&l_1);
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s(ppcStack_18,(char *)l_1);
          if (iVar1 == 0) {
            properties._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"get_message_correlation_id",0xfa,1,"Failed cloning correlation-id");
            }
            properties._4_4_ = 0xfb;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"get_message_correlation_id",0xf5,1,
                      "Failed retrieving string from AMQP value");
          }
          properties._4_4_ = 0xf6;
        }
      }
      else {
        *ppcStack_18 = (char *)0x0;
        properties._4_4_ = 0;
      }
      properties_destroy((PROPERTIES_HANDLE)amqp_value);
    }
  }
  else {
    value = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)value != (LOGGER_LOG)0x0) {
      (*(code *)value)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                       ,"get_message_correlation_id",0xe0,1,"Failed getting AMQP message properties"
                      );
    }
    properties._4_4_ = 0xe1;
  }
  return properties._4_4_;
}

Assistant:

static int get_message_correlation_id(MESSAGE_HANDLE message, char** correlation_id)
{
    int result;

    PROPERTIES_HANDLE properties;
    AMQP_VALUE amqp_value;

    if (message_get_properties(message, &properties) != 0)
    {
        LogError("Failed getting AMQP message properties");
        result = MU_FAILURE;
    }
    else if (properties == NULL)
    {
        *correlation_id = NULL;
        result = RESULT_OK;
    }
    else
    {
        if (properties_get_correlation_id(properties, &amqp_value) != 0 || amqp_value == NULL)
        {
            *correlation_id = NULL;
            result = RESULT_OK;
        }
        else
        {
            const char* value;

            if (amqpvalue_get_string(amqp_value, &value) != 0)
            {
                LogError("Failed retrieving string from AMQP value");
                result = MU_FAILURE;
            }
            else if (mallocAndStrcpy_s(correlation_id, value) != 0)
            {
                LogError("Failed cloning correlation-id");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }

        properties_destroy(properties);
    }

    return result;
}